

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxRuntime.cpp
# Opt level: O0

PerformanceStats * __thiscall
Jinx::Impl::Runtime::GetScriptPerformanceStats
          (PerformanceStats *__return_storage_ptr__,Runtime *this,bool resetStats)

{
  uint64_t uVar1;
  PerformanceStats local_80;
  duration<long,_std::ratio<1L,_1000000000L>_> local_38;
  duration<long,_std::ratio<1L,_1000000000L>_> local_30;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_28;
  time_point end;
  lock_guard<std::mutex> lock;
  bool resetStats_local;
  Runtime *this_local;
  
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&end,&this->m_perfMutex);
  local_28.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_38.__r = (rep)std::chrono::operator-(&local_28,&this->m_perfStartTime);
  local_30.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                                (&local_38);
  uVar1 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_30);
  (this->m_perfStats).perfTimeNs = uVar1;
  memcpy(__return_storage_ptr__,&this->m_perfStats,0x38);
  if (resetStats) {
    memset(&local_80,0,0x38);
    PerformanceStats::PerformanceStats(&local_80);
    memcpy(&this->m_perfStats,&local_80,0x38);
    (this->m_perfStartTime).__d.__r = (rep)local_28.__d.__r;
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&end);
  return __return_storage_ptr__;
}

Assistant:

inline_t PerformanceStats Runtime::GetScriptPerformanceStats(bool resetStats)
	{
		std::lock_guard<std::mutex> lock(m_perfMutex);
		auto end = std::chrono::high_resolution_clock::now();
		m_perfStats.perfTimeNs = std::chrono::duration_cast<std::chrono::nanoseconds>(end - m_perfStartTime).count();
		PerformanceStats s = m_perfStats;
		if (resetStats)
		{
			m_perfStats = PerformanceStats();
			m_perfStartTime = end;
		}
		return s;
	}